

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O2

void cw_out_bufs_free(cw_out_ctx *ctx)

{
  cw_out_buf *pcVar1;
  cw_out_buf *cwbuf;
  
  cwbuf = ctx->buf;
  while (cwbuf != (cw_out_buf *)0x0) {
    pcVar1 = cwbuf->next;
    cw_out_buf_free(cwbuf);
    ctx->buf = pcVar1;
    cwbuf = pcVar1;
  }
  return;
}

Assistant:

static void cw_out_bufs_free(struct cw_out_ctx *ctx)
{
  while(ctx->buf) {
    struct cw_out_buf *next = ctx->buf->next;
    cw_out_buf_free(ctx->buf);
    ctx->buf = next;
  }
}